

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O2

void __thiscall streams_tests::streams_hashed::test_method(streams_hashed *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  string *psVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined **local_1f8;
  undefined1 local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  DataStream local_1b8;
  uint256 local_198;
  uint256 local_178;
  string result;
  HashVerifier<DataStream> hash_verifier;
  string data;
  HashedSourceWriter<DataStream> hash_writer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1b8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.m_read_pos = 0;
  local_1b8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  HashedSourceWriter<DataStream>::HashedSourceWriter(&hash_writer,&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"bitcoin",(allocator<char> *)&hash_verifier);
  Serialize<HashedSourceWriter<DataStream>,char>(&hash_writer,&data);
  CSHA256::CSHA256((CSHA256 *)&hash_verifier);
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  hash_verifier.m_source = &local_1b8;
  Unserialize<HashVerifier<DataStream>,char>(&hash_verifier,&result);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x236;
  file.m_begin = (iterator)&local_1c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d8,msg);
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_011480b0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_200 = "";
  pvVar2 = (iterator)0x2;
  psVar3 = &data;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_1f8,&local_208,0x236,1,2,psVar3,"data",&result,"result");
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x237;
  file_00.m_begin = (iterator)&local_218;
  msg_00.m_end = (iterator)psVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_228,
             msg_00);
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_011480b0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_230 = "";
  HashWriter::GetHash(&local_178,&hash_writer.super_HashWriter);
  HashWriter::GetHash(&local_198,&hash_verifier.super_HashWriter);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_1f8,&local_238,0x237,1,2,&local_178,"hash_writer.GetHash()",&local_198,
             "hash_verifier.GetHash()");
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&data);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_1b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_hashed)
{
    DataStream stream{};
    HashedSourceWriter hash_writer{stream};
    const std::string data{"bitcoin"};
    hash_writer << data;

    HashVerifier hash_verifier{stream};
    std::string result;
    hash_verifier >> result;
    BOOST_CHECK_EQUAL(data, result);
    BOOST_CHECK_EQUAL(hash_writer.GetHash(), hash_verifier.GetHash());
}